

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraALU_cpp.h
# Opt level: O0

u32 __thiscall moira::Moira::logic<(moira::Core)0,(moira::Instr)84,4>(Moira *this,u32 op)

{
  u32 uVar1;
  u32 result;
  u32 op_local;
  Moira *this_local;
  
  uVar1 = addsub<(moira::Core)0,(moira::Instr)119,4>(this,op,0);
  return uVar1;
}

Assistant:

u32
Moira::logic(u32 op)
{
    u32 result;

    switch (I) {

        case Instr::NOT:
        case Instr::NOT_LOOP:

            result = ~op;
            reg.sr.n = NBIT<S>(result);
            reg.sr.z = ZERO<S>(result);
            reg.sr.v = 0;
            reg.sr.c = 0;
            break;

        case Instr::NEG:
        case Instr::NEG_LOOP:

            result = addsub<C, Instr::SUB, S>(op, 0);
            break;

        case Instr::NEGX:
        case Instr::NEGX_LOOP:

            result = addsub<C, Instr::SUBX, S>(op, 0);
            break;

        default:
            fatalError;
    }
    return result;
}